

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_bitshift(ASMState *as,IRIns *ir,x86Shift xs)

{
  byte bVar1;
  ushort uVar2;
  IRIns *pIVar3;
  MCode *pMVar4;
  Reg r2;
  uint uVar5;
  Reg r2_00;
  uint uVar6;
  Reg r1;
  x86Op xo;
  
  uVar2 = (ir->field_0).op2;
  pIVar3 = as->ir;
  if ((short)uVar2 < 0) {
    r2 = ra_dest(as,ir,0xffed);
    if (r2 == 1) {
      r2 = ra_scratch(as,0xffed);
      emit_rr(as,XO_MOV,1,r2);
    }
    bVar1 = *(byte *)((long)pIVar3 + (ulong)uVar2 * 8 + 6);
    r2_00 = (Reg)bVar1;
    if ((char)bVar1 < '\0') {
      r2_00 = ra_allocref(as,(uint)uVar2,2);
    }
    else if (bVar1 == 1) {
      r2_00 = 1;
    }
    else {
      ra_scratch(as,2);
    }
    uVar6._0_2_ = *(IROpT *)((long)ir + 4);
    uVar6._2_2_ = *(IRRef1 *)((long)ir + 6);
    emit_rr(as,XO_SHIFTcl,(-(uint)((0x604208U >> (uVar6 & 0x1f) & 1) != 0) & 0x80200) + xs,r2);
    bVar1 = (byte)r2_00 & 0x1f;
    as->weakset = as->weakset & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    if (r2_00 == 1) goto LAB_001392cc;
    r1 = 1;
    xo = XO_MOV;
  }
  else {
    r2 = ra_dest(as,ir,0xffef);
    uVar6 = 0x604208U >> ((ir->field_1).t.irt & 0x1f) & 1;
    uVar5 = (uVar6 << 5 | 0x1f) & pIVar3[uVar2].field_1.op12;
    if (uVar5 == 0) goto LAB_001392cc;
    if (uVar5 == 1) {
      xo = XO_SHIFT1;
    }
    else {
      pMVar4 = as->mcp;
      as->mcp = pMVar4 + -1;
      pMVar4[-1] = (MCode)uVar5;
      uVar5._0_2_ = *(IROpT *)((long)ir + 4);
      uVar5._2_2_ = *(IRRef1 *)((long)ir + 6);
      uVar6 = (uint)((0x604208U >> (uVar5 & 0x1f) & 1) != 0);
      xo = XO_SHIFTi;
    }
    r1 = (-uVar6 & 0x80200) + xs;
    r2_00 = r2;
  }
  emit_rr(as,xo,r1,r2_00);
LAB_001392cc:
  ra_left(as,r2,(uint)(ir->field_0).op1);
  return;
}

Assistant:

static void asm_bitshift(ASMState *as, IRIns *ir, x86Shift xs)
{
  IRRef rref = ir->op2;
  IRIns *irr = IR(rref);
  Reg dest;
  if (irref_isk(rref)) {  /* Constant shifts. */
    int shift;
    dest = ra_dest(as, ir, RSET_GPR);
    shift = irr->i & (irt_is64(ir->t) ? 63 : 31);
    switch (shift) {
    case 0: break;
    case 1: emit_rr(as, XO_SHIFT1, REX_64IR(ir, xs), dest); break;
    default: emit_shifti(as, REX_64IR(ir, xs), dest, shift); break;
    }
  } else {  /* Variable shifts implicitly use register cl (i.e. ecx). */
    Reg right;
    dest = ra_dest(as, ir, rset_exclude(RSET_GPR, RID_ECX));
    if (dest == RID_ECX) {
      dest = ra_scratch(as, rset_exclude(RSET_GPR, RID_ECX));
      emit_rr(as, XO_MOV, RID_ECX, dest);
    }
    right = irr->r;
    if (ra_noreg(right))
      right = ra_allocref(as, rref, RID2RSET(RID_ECX));
    else if (right != RID_ECX)
      ra_scratch(as, RID2RSET(RID_ECX));
    emit_rr(as, XO_SHIFTcl, REX_64IR(ir, xs), dest);
    ra_noweak(as, right);
    if (right != RID_ECX)
      emit_rr(as, XO_MOV, RID_ECX, right);
  }
  ra_left(as, dest, ir->op1);
  /*
  ** Note: avoid using the flags resulting from a shift or rotate!
  ** All of them cause a partial flag stall, except for r,1 shifts
  ** (but not rotates). And a shift count of 0 leaves the flags unmodified.
  */
}